

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

StrMap * jsonnet::internal::jsonnet_vm_execute_multi
                   (StrMap *__return_storage_ptr__,Allocator *alloc,AST *ast,ExtMap *ext_vars,
                   uint max_stack,double gc_min_objects,double gc_growth_trigger,
                   VmNativeCallbackMap *natives,JsonnetImportCallback *import_callback,void *ctx,
                   bool string_output)

{
  _Rb_tree_header *p_Var1;
  key_type *__k;
  anon_union_8_3_4e909c26_for_v this;
  mapped_type *ppIVar2;
  undefined8 uVar3;
  AST *ast_;
  mapped_type *this_00;
  _Base_ptr p_Var4;
  ostream *poVar5;
  RuntimeError *__return_storage_ptr___00;
  undefined1 manifesting;
  Type t;
  UString vstr;
  UString local_418;
  LocationRange loc;
  string local_3b8;
  map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
  fields;
  Interpreter vm;
  
  manifesting = (undefined1)max_stack;
  anon_unknown_0::Interpreter::Interpreter
            (&vm,alloc,ext_vars,max_stack,gc_min_objects,gc_growth_trigger,natives,import_callback,
             ctx);
  anon_unknown_0::Interpreter::evaluate(&vm,ast,0);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fields,"During manifestation",(allocator<char> *)&vstr);
  LocationRange::LocationRange(&loc,(string *)&fields);
  std::__cxx11::string::~string((string *)&fields);
  this = vm.scratch.v;
  if (vm.scratch.t == OBJECT) {
    anon_unknown_0::Interpreter::runInvariants(&vm,&loc,(HeapObject *)vm.scratch.v.h);
    fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fields._M_t._M_impl.super__Rb_tree_header._M_header;
    fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    anon_unknown_0::Interpreter::objectFields
              ((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)&vstr,(Interpreter *)this.h,(HeapObject *)0x1,(bool)manifesting);
    for (uVar3 = vstr.field_2._8_8_; (size_type *)uVar3 != &vstr._M_string_length;
        uVar3 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar3)) {
      __k = *(key_type **)(uVar3 + 0x20);
      ppIVar2 = std::
                map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                ::operator[](&fields,__k);
      *ppIVar2 = (mapped_type)__k;
    }
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)&vstr);
    for (p_Var4 = fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &fields._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      ast_ = anon_unknown_0::Interpreter::objectIndex
                       (&vm,&loc,(HeapObject *)this.h,*(Identifier **)(p_Var4 + 2),0);
      vm.stack.stack.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].val.t = vm.scratch.t;
      *(undefined4 *)
       &vm.stack.stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].val.field_0x4 = vm.scratch._4_4_;
      vm.stack.stack.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].val.v = vm.scratch.v;
      anon_unknown_0::Interpreter::evaluate
                (&vm,ast_,(uint)(((long)vm.stack.stack.
                                        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)vm.stack.stack.
                                       super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 400));
      if (string_output) {
        (anonymous_namespace)::Interpreter::manifestString_abi_cxx11_
                  (&vstr,(Interpreter *)&vm,&ast_->location);
      }
      else {
        std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                  ((u32string *)&local_418,L"",(allocator<char32_t> *)&local_3b8);
        anon_unknown_0::Interpreter::manifestJson(&vstr,&vm,&ast_->location,true,&local_418);
        std::__cxx11::u32string::~u32string((u32string *)&local_418);
      }
      vm.scratch.t = vm.stack.stack.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].val.t;
      vm.scratch._4_4_ =
           *(undefined4 *)
            &vm.stack.stack.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].val.field_0x4;
      vm.scratch.v = vm.stack.stack.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].val.v;
      anon_unknown_0::Stack::pop(&vm.stack);
      encode_utf8((string *)&local_418,&vstr);
      encode_utf8(&local_3b8,(UString *)(p_Var4 + 1));
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](__return_storage_ptr__,&local_3b8);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_418);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::u32string::~u32string((u32string *)&vstr);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
    ::~_Rb_tree(&fields._M_t);
    std::__cxx11::string::~string((string *)&loc);
    anon_unknown_0::Interpreter::~Interpreter(&vm);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&fields);
  poVar5 = std::operator<<((ostream *)&fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                           ,"multi mode: top-level object was a ");
  (anonymous_namespace)::type_str_abi_cxx11_
            ((string *)&vstr,(_anonymous_namespace_ *)(vm.scratch._0_8_ & 0xffffffff),t);
  poVar5 = std::operator<<(poVar5,(string *)&vstr);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,"should be an object whose keys are filenames and values hold ");
  std::operator<<(poVar5,"the JSON for that file.");
  std::__cxx11::string::~string((string *)&vstr);
  __return_storage_ptr___00 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  anon_unknown_0::Stack::makeError(__return_storage_ptr___00,&vm.stack,&loc,(string *)&vstr);
  __cxa_throw(__return_storage_ptr___00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

StrMap jsonnet_vm_execute_multi(Allocator *alloc, const AST *ast, const ExtMap &ext_vars,
                                unsigned max_stack, double gc_min_objects, double gc_growth_trigger,
                                const VmNativeCallbackMap &natives,
                                JsonnetImportCallback *import_callback, void *ctx,
                                bool string_output)
{
    Interpreter vm(alloc,
                   ext_vars,
                   max_stack,
                   gc_min_objects,
                   gc_growth_trigger,
                   natives,
                   import_callback,
                   ctx);
    vm.evaluate(ast, 0);
    return vm.manifestMulti(string_output);
}